

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathLangFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  byte *pbVar1;
  xmlChar *pxVar2;
  xmlNode *node;
  int iVar3;
  xmlXPathObjectPtr pxVar4;
  __int32_t **pp_Var5;
  uint val;
  _xmlNode **pp_Var6;
  ulong uVar7;
  long lVar8;
  int iStack_50;
  xmlChar *theLang;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    if (ctxt->valueNr < 1) {
      iStack_50 = 0x17;
    }
    else {
      if (ctxt->value != (xmlXPathObjectPtr)0x0) {
        if (ctxt->value->type == XPATH_STRING) {
LAB_001b452b:
          pxVar4 = xmlXPathValuePop(ctxt);
          pxVar2 = pxVar4->stringval;
          pp_Var6 = &ctxt->context->node;
          do {
            node = *pp_Var6;
            if (node == (xmlNode *)0x0) {
              val = 0;
              goto LAB_001b460b;
            }
            iVar3 = xmlNodeGetAttrValue(node,"lang",
                                        (xmlChar *)"http://www.w3.org/XML/1998/namespace",&theLang);
            if (iVar3 < 0) {
              xmlXPathPErrMemory(ctxt);
            }
            pp_Var6 = &node->parent;
          } while (theLang == (xmlChar *)0x0);
          if (pxVar2 != (xmlChar *)0x0) {
            lVar8 = 0;
            do {
              uVar7 = (ulong)pxVar2[lVar8];
              if (uVar7 == 0) {
                val = (uint)(theLang[lVar8] == '-' || theLang[lVar8] == '\0');
                goto LAB_001b45ff;
              }
              pp_Var5 = __ctype_toupper_loc();
              pbVar1 = theLang + lVar8;
              lVar8 = lVar8 + 1;
            } while ((*pp_Var5)[uVar7] == (*pp_Var5)[*pbVar1]);
          }
          val = 0;
LAB_001b45ff:
          (*xmlFree)(theLang);
LAB_001b460b:
          xmlXPathReleaseObject(ctxt->context,pxVar4);
          pxVar4 = xmlXPathCacheNewBoolean(ctxt,val);
          xmlXPathValuePush(ctxt,pxVar4);
          return;
        }
        xmlXPathStringFunction(ctxt,1);
        if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type == XPATH_STRING))
        goto LAB_001b452b;
      }
      iStack_50 = 0xb;
    }
  }
  else {
    iStack_50 = 0xc;
  }
  xmlXPathErr(ctxt,iStack_50);
  return;
}

Assistant:

void
xmlXPathLangFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr val;
    xmlNodePtr cur;
    xmlChar *theLang;
    const xmlChar *lang;
    int ret = 0;
    int i;

    CHECK_ARITY(1);
    CAST_TO_STRING;
    CHECK_TYPE(XPATH_STRING);
    val = xmlXPathValuePop(ctxt);
    lang = val->stringval;
    cur = ctxt->context->node;
    while (cur != NULL) {
        if (xmlNodeGetAttrValue(cur, BAD_CAST "lang", XML_XML_NAMESPACE,
                                &theLang) < 0)
            xmlXPathPErrMemory(ctxt);
        if (theLang != NULL)
            break;
        cur = cur->parent;
    }
    if ((theLang != NULL) && (lang != NULL)) {
        for (i = 0;lang[i] != 0;i++)
            if (toupper(lang[i]) != toupper(theLang[i]))
                goto not_equal;
        if ((theLang[i] == 0) || (theLang[i] == '-'))
            ret = 1;
    }
not_equal:
    if (theLang != NULL)
	xmlFree((void *)theLang);

    xmlXPathReleaseObject(ctxt->context, val);
    xmlXPathValuePush(ctxt, xmlXPathCacheNewBoolean(ctxt, ret));
}